

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.cc
# Opt level: O0

void __thiscall
trng::mrg5s::seed(mrg5s *this,result_type s1,result_type s2,result_type s3,result_type s4,
                 result_type s5)

{
  result_type s5_local;
  result_type s4_local;
  result_type s3_local;
  result_type s2_local;
  result_type s1_local;
  mrg5s *this_local;
  
  (this->S).r[0] = s1 % 0x7fffa78f;
  if ((this->S).r[0] < 0) {
    (this->S).r[0] = (this->S).r[0] + 0x7fffa78f;
  }
  (this->S).r[1] = s2 % 0x7fffa78f;
  if ((this->S).r[1] < 0) {
    (this->S).r[1] = (this->S).r[1] + 0x7fffa78f;
  }
  (this->S).r[2] = s3 % 0x7fffa78f;
  if ((this->S).r[2] < 0) {
    (this->S).r[2] = (this->S).r[2] + 0x7fffa78f;
  }
  (this->S).r[3] = s4 % 0x7fffa78f;
  if ((this->S).r[3] < 0) {
    (this->S).r[3] = (this->S).r[3] + 0x7fffa78f;
  }
  (this->S).r[4] = s5 % 0x7fffa78f;
  if ((this->S).r[4] < 0) {
    (this->S).r[4] = (this->S).r[4] + 0x7fffa78f;
  }
  return;
}

Assistant:

void mrg5s::seed(mrg5s::result_type s1, mrg5s::result_type s2, mrg5s::result_type s3,
                   mrg5s::result_type s4, mrg5s::result_type s5) {
    S.r[0] = s1 % modulus;
    if (S.r[0] < 0)
      S.r[0] += modulus;
    S.r[1] = s2 % modulus;
    if (S.r[1] < 0)
      S.r[1] += modulus;
    S.r[2] = s3 % modulus;
    if (S.r[2] < 0)
      S.r[2] += modulus;
    S.r[3] = s4 % modulus;
    if (S.r[3] < 0)
      S.r[3] += modulus;
    S.r[4] = s5 % modulus;
    if (S.r[4] < 0)
      S.r[4] += modulus;
  }